

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O1

int SUNLinSolSetScalingVectors_PCG(SUNLinearSolver S,N_Vector s,N_Vector nul)

{
  void *pvVar1;
  
  if (S != (SUNLinearSolver)0x0) {
    pvVar1 = S->content;
    *(N_Vector *)((long)pvVar1 + 0x48) = s;
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
    return 0;
  }
  return -1;
}

Assistant:

int SUNLinSolSetScalingVectors_PCG(SUNLinearSolver S, N_Vector s,
                                   N_Vector nul)
{
  /* set N_Vector pointer to integrator-supplied scaling vector
     (only use the first one), and return with success */
  if (S == NULL) return(SUNLS_MEM_NULL);
  PCG_CONTENT(S)->s = s;
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}